

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O1

void out_token(Token *token)

{
  char *pcVar1;
  
  if (token->kind == NEWLINE) {
    pcVar1 = "<New Line>";
  }
  else {
    pcVar1 = token->text;
  }
  print("<Kind=%s<%d>, (%d,%d)>",pcVar1,(ulong)token->kind,(ulong)token->row_pos,
        (ulong)token->col_pos);
  return;
}

Assistant:

void out_token(Token *token) {
    char *s = token->text;
    if (token->kind == NEWLINE) {
        s = "<New Line>";
    }
    print("<Kind=%s<%d>, (%d,%d)>",
          s,
          token->kind,
          token->row_pos,
          token->col_pos);
}